

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void pulse_sink_info_cb(pa_context *context,pa_sink_info *info,int eol,void *user_data)

{
  int iVar1;
  cubeb_device_state cVar2;
  cubeb_device_fmt cVar3;
  undefined8 *__s;
  char *pcVar4;
  undefined4 uVar5;
  undefined8 *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  char *device_id;
  char *prop;
  cubeb_device_info *devinfo;
  pulse_dev_list_data *list_data;
  char **id;
  
  if (in_EDX == 0) {
    if (in_RSI != (undefined8 *)0x0) {
      id = (char **)*in_RSI;
      iVar1 = intern_device_id((cubeb_conflict *)0x0,id);
      if (iVar1 != 0) {
        __assert_fail("NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                      ,0x53e,
                      "void pulse_sink_info_cb(pa_context *, const pa_sink_info *, int, void *)");
      }
      pulse_ensure_dev_list_data_list_size((pulse_dev_list_data *)0x11b4b1);
      __s = (undefined8 *)(in_RCX[2] + (ulong)*(uint *)((long)in_RCX + 0x1c) * 0x58);
      memset(__s,0,0x58);
      __s[1] = id;
      *__s = __s[1];
      pcVar4 = strdup((char *)in_RSI[2]);
      __s[2] = pcVar4;
      pcVar4 = (*cubeb_pa_proplist_gets)((pa_proplist *)in_RSI[0x2b],"sysfs.path");
      if (pcVar4 != (char *)0x0) {
        pcVar4 = strdup(pcVar4);
        __s[3] = pcVar4;
      }
      pcVar4 = (*cubeb_pa_proplist_gets)((pa_proplist *)in_RSI[0x2b],"device.vendor.name");
      if (pcVar4 != (char *)0x0) {
        pcVar4 = strdup(pcVar4);
        __s[4] = pcVar4;
      }
      *(undefined4 *)(__s + 5) = 2;
      cVar2 = pulse_get_state_from_sink_port((pa_sink_port_info *)in_RSI[0x31]);
      *(cubeb_device_state *)((long)__s + 0x2c) = cVar2;
      iVar1 = strcmp((char *)*in_RSI,(char *)*in_RCX);
      uVar5 = 0;
      if (iVar1 == 0) {
        uVar5 = 0xf;
      }
      *(undefined4 *)(__s + 6) = uVar5;
      *(undefined4 *)((long)__s + 0x34) = 0x3030;
      cVar3 = pulse_format_to_cubeb_format(*(pa_sample_format_t *)(in_RSI + 3));
      *(cubeb_device_fmt *)(__s + 7) = cVar3;
      *(uint *)((long)__s + 0x3c) = (uint)*(byte *)((long)in_RSI + 0x24);
      *(undefined4 *)(__s + 9) = 1;
      *(undefined4 *)((long)__s + 0x44) = 0x5dc00;
      *(undefined4 *)(__s + 8) = *(undefined4 *)((long)in_RSI + 0x1c);
      *(undefined4 *)((long)__s + 0x4c) = 0;
      *(undefined4 *)(__s + 10) = 0;
      *(int *)((long)in_RCX + 0x1c) = *(int *)((long)in_RCX + 0x1c) + 1;
    }
  }
  else {
    (*cubeb_pa_threaded_mainloop_signal)(*(pa_threaded_mainloop **)(in_RCX[4] + 0x10),0);
  }
  return;
}

Assistant:

static void
pulse_sink_info_cb(pa_context * context, const pa_sink_info * info, int eol,
                   void * user_data)
{
  pulse_dev_list_data * list_data = user_data;
  cubeb_device_info * devinfo;
  char const * prop = NULL;
  char const * device_id = NULL;

  (void)context;

  if (eol) {
    WRAP(pa_threaded_mainloop_signal)(list_data->context->mainloop, 0);
    return;
  }

  if (info == NULL)
    return;

  device_id = info->name;
  if (intern_device_id(list_data->context, &device_id) != CUBEB_OK) {
    assert(NULL);
    return;
  }

  pulse_ensure_dev_list_data_list_size(list_data);
  devinfo = &list_data->devinfo[list_data->count];
  memset(devinfo, 0, sizeof(cubeb_device_info));

  devinfo->device_id = device_id;
  devinfo->devid = (cubeb_devid)devinfo->device_id;
  devinfo->friendly_name = strdup(info->description);
  prop = WRAP(pa_proplist_gets)(info->proplist, "sysfs.path");
  if (prop)
    devinfo->group_id = strdup(prop);
  prop = WRAP(pa_proplist_gets)(info->proplist, "device.vendor.name");
  if (prop)
    devinfo->vendor_name = strdup(prop);

  devinfo->type = CUBEB_DEVICE_TYPE_OUTPUT;
  devinfo->state = pulse_get_state_from_sink_port(info->active_port);
  devinfo->preferred = (strcmp(info->name, list_data->default_sink_name) == 0)
                           ? CUBEB_DEVICE_PREF_ALL
                           : CUBEB_DEVICE_PREF_NONE;

  devinfo->format = CUBEB_DEVICE_FMT_ALL;
  devinfo->default_format =
      pulse_format_to_cubeb_format(info->sample_spec.format);
  devinfo->max_channels = info->channel_map.channels;
  devinfo->min_rate = 1;
  devinfo->max_rate = PA_RATE_MAX;
  devinfo->default_rate = info->sample_spec.rate;

  devinfo->latency_lo = 0;
  devinfo->latency_hi = 0;

  list_data->count += 1;
}